

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O2

void __thiscall validation_layer::basic_leakChecker::basic_leakChecker(basic_leakChecker *this)

{
  bool bVar1;
  ZEbasic_leakChecker *this_00;
  undefined8 *puVar2;
  validationChecker *local_20;
  
  this->enablebasic_leak = false;
  bVar1 = getenv_tobool("ZEL_ENABLE_BASIC_LEAK_CHECKER");
  this->enablebasic_leak = bVar1;
  if (bVar1) {
    this_00 = (ZEbasic_leakChecker *)operator_new(0x40);
    ZEbasic_leakChecker::ZEbasic_leakChecker(this_00);
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = &PTR_zesInitPrologue_001d4e70;
    DAT_001dc6a0 = (undefined8 *)operator_new(8);
    *DAT_001dc6a0 = &PTR_zetModuleGetDebugInfoPrologue_001d57f8;
    local_20 = (validationChecker *)&basic_leak_checker;
    basic_leak_checker = this_00;
    DAT_001dc698 = puVar2;
    std::
    vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
    ::emplace_back<validation_layer::validationChecker*>
              ((vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
                *)(context + 0xd30),&local_20);
  }
  return;
}

Assistant:

basic_leakChecker::basic_leakChecker() {
        enablebasic_leak = getenv_tobool( "ZEL_ENABLE_BASIC_LEAK_CHECKER" );
        if(enablebasic_leak) {
            basic_leakChecker::ZEbasic_leakChecker *zeChecker = new basic_leakChecker::ZEbasic_leakChecker;
            basic_leakChecker::ZESbasic_leakChecker *zesChecker = new basic_leakChecker::ZESbasic_leakChecker;
            basic_leakChecker::ZETbasic_leakChecker *zetChecker = new basic_leakChecker::ZETbasic_leakChecker;
            basic_leak_checker.zeValidation = zeChecker;
            basic_leak_checker.zetValidation = zetChecker;
            basic_leak_checker.zesValidation = zesChecker;
            validation_layer::context.validationHandlers.push_back(&basic_leak_checker);
        }
    }